

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  double dVar1;
  double dVar2;
  reference pFVar3;
  reference piVar4;
  Scalar *pSVar5;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *matrix;
  ReturnType RVar6;
  Scal SVar7;
  Scal SVar8;
  int j_2;
  Scal dist2;
  int j_1;
  Scal dMax;
  Scal dof;
  int k;
  Scal p_value;
  Scal max_p_value;
  int j;
  Vec sumWsq;
  Vec T;
  Vec dist;
  X diffX;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffca8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffcb0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffcb8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffcc0;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_fffffffffffffcc8;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffcd0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffcd8;
  int local_1bc;
  int local_1ac;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_1a8;
  int local_184;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *local_178;
  int local_a4;
  bool local_1;
  
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x2a2154);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcc0,
             (int *)in_stack_fffffffffffffcb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffcb8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffcb8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
  ;
  for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0xb0); local_a4 = local_a4 + 1) {
    pFVar3 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_a4);
    LinearExpert<1,_1>::getPredX(&pFVar3->super_LinearExpert<1,_1>);
    piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_a4);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)(in_RDI + 0x1a8),(long)*piVar4);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffcb0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                *)in_stack_fffffffffffffca8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffcc0,(Index)in_stack_fffffffffffffcb8);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_fffffffffffffcb0);
    Eigen::
    DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
    ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                 *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
            dot<Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,1,1,0,1,1>,1>>
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                       in_stack_fffffffffffffcb0,
                       (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                        *)in_stack_fffffffffffffca8);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    *pSVar5 = RVar6;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    dVar1 = *pSVar5;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_a4);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    *pSVar5 = *pSVar5 + dVar1;
    pFVar3 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_a4);
    SVar7 = LinearExpert<1,_1>::get_p_z(&pFVar3->super_LinearExpert<1,_1>);
    pFVar3 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_a4);
    SVar8 = LinearExpert<1,_1>::get_p_z(&pFVar3->super_LinearExpert<1,_1>);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_a4);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    *pSVar5 = SVar7 * SVar8 + *pSVar5;
  }
  *in_RCX = -1;
  local_178 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0xbff0000000000000;
  for (local_184 = 0; local_184 < *(int *)(in_RDI + 0x254); local_184 = local_184 + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    dVar1 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    dVar2 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    if ((1.0 <= ((dVar1 * dVar2) / *pSVar5 - 1.0) * 1.0 + 1.0) &&
       (pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8),
       0.0 < *pSVar5)) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution
                ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  *)in_stack_fffffffffffffcc0,(double)in_stack_fffffffffffffcb8);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
      in_stack_fffffffffffffcd8 =
           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
           boost::math::
           cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                     (in_stack_fffffffffffffcc8,(double *)in_stack_fffffffffffffcc0);
      if ((double)local_178 <= (double)in_stack_fffffffffffffcd8) {
        *in_RCX = local_184;
        local_178 = in_stack_fffffffffffffcd8;
      }
    }
  }
  if (*(double *)(in_RDI + 0x60) < (double)local_178) {
    local_1a8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0xbff0000000000000;
    for (local_1ac = 0; local_1ac < *(int *)(in_RDI + 0xb0); local_1ac = local_1ac + 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_1ac);
      if ((*piVar4 == *in_RCX) &&
         (in_stack_fffffffffffffcd0 =
               (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8),
         (double)local_1a8 < *(double *)in_stack_fffffffffffffcd0)) {
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
        local_1a8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)*pSVar5;
        *in_RSI = local_1ac;
      }
    }
    local_1a8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0xbff0000000000000;
    for (local_1bc = 0; local_1bc < *(int *)(in_RDI + 0xb0); local_1bc = local_1bc + 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_1bc);
      if (*piVar4 == *in_RCX) {
        matrix = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x98);
        pFVar3 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)matrix,(long)local_1bc);
        this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                  LinearExpert<1,_1>::getPredX(&pFVar3->super_LinearExpert<1,_1>);
        pFVar3 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)matrix,(long)*in_RSI);
        LinearExpert<1,_1>::getPredX(&pFVar3->super_LinearExpert<1,_1>);
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        Eigen::Matrix<double,1,1,0,1,1>::operator=
                  ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffcb0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    *)in_stack_fffffffffffffca8);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(this_00,(Index)matrix);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
        asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffcb0);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
        ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)this_00,matrix);
        in_stack_fffffffffffffcb0 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
             dot<Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,1,1,0,1,1>,1>>
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                        in_stack_fffffffffffffcb0,
                        (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                         *)in_stack_fffffffffffffca8);
        if ((double)local_1a8 < (double)in_stack_fffffffffffffcb0) {
          *in_RDX = local_1bc;
          local_1a8 = in_stack_fffffffffffffcb0;
        }
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2a29e3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2a29f2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2a2a03);
  return local_1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}